

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootchart.c
# Opt level: O0

int bootchart_step(void)

{
  int iVar1;
  undefined8 in_RAX;
  char buff [2];
  size_t in_stack_00000010;
  char *in_stack_00000018;
  char *in_stack_00000020;
  char *in_stack_00000408;
  FileBuff in_stack_00000410;
  FileBuff in_stack_00000870;
  undefined1 local_6;
  undefined4 local_4;
  
  do_log_file(in_stack_00000410,in_stack_00000408);
  do_log_file(in_stack_00000410,in_stack_00000408);
  do_log_procs(in_stack_00000870);
  iVar1 = proc_read(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  if ((iVar1 < 1) || (local_6 = (char)((ulong)in_RAX >> 0x10), local_6 != '1')) {
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int  bootchart_step( void )
{
    do_log_file(log_stat,   "/proc/stat");
    do_log_file(log_disks,  "/proc/diskstats");
    do_log_procs(log_procs);

    /* we stop when /data/bootchart-stop contains 1 */
    {
        char  buff[2];
        if (proc_read(LOG_STOPFILE,buff,sizeof(buff)) > 0 && buff[0] == '1') {
            return -1;
        }
    }

    return 0;
}